

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,JumpStatement *jump_statement)

{
  JumpStatement *this_00;
  Label local_38;
  JumpStatement *local_18;
  JumpStatement *jump_statement_local;
  BlockFormerVisitor *this_local;
  
  this->block_finished_ = true;
  local_18 = jump_statement;
  jump_statement_local = (JumpStatement *)this;
  this_00 = (JumpStatement *)operator_new(0x28);
  Label::Label(&local_38,&local_18->label_);
  JumpStatement::JumpStatement(this_00,&local_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  Label::~Label(&local_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(JumpStatement* jump_statement) {
  block_finished_ = true;
  tos_value_.statement_ = new JumpStatement(jump_statement->label_);
}